

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cimgui.cpp
# Opt level: O1

ImDrawIdx * ImVector_ImDrawIdx_insert(ImVector_ImDrawIdx *self,ImDrawIdx *it,ImDrawIdx v)

{
  int iVar1;
  int iVar2;
  ImDrawIdx *pIVar3;
  unsigned_short *__dest;
  int iVar4;
  long lVar5;
  long lVar6;
  int iVar7;
  
  pIVar3 = self->Data;
  if ((pIVar3 <= it) && (iVar1 = self->Size, it <= pIVar3 + iVar1)) {
    lVar6 = (long)it - (long)pIVar3;
    iVar2 = self->Capacity;
    if (iVar1 == iVar2) {
      if (iVar2 == 0) {
        iVar4 = 8;
      }
      else {
        iVar4 = iVar2 / 2 + iVar2;
      }
      iVar7 = iVar1 + 1;
      if (iVar1 + 1 < iVar4) {
        iVar7 = iVar4;
      }
      if (iVar2 < iVar7) {
        __dest = (unsigned_short *)ImGui::MemAlloc((long)iVar7 * 2);
        if (self->Data != (unsigned_short *)0x0) {
          memcpy(__dest,self->Data,(long)self->Size * 2);
          ImGui::MemFree(self->Data);
        }
        self->Data = __dest;
        self->Capacity = iVar7;
      }
    }
    lVar5 = (long)self->Size - (lVar6 >> 1);
    if (lVar5 != 0 && lVar6 >> 1 <= (long)self->Size) {
      memmove((void *)((long)self->Data + lVar6 + 2),(void *)((long)self->Data + lVar6),lVar5 * 2);
    }
    *(ImDrawIdx *)((long)self->Data + lVar6) = v;
    self->Size = self->Size + 1;
    return (ImDrawIdx *)(lVar6 + (long)self->Data);
  }
  __assert_fail("it >= Data && it <= Data+Size",
                "/workspace/llm4binary/github/license_all_cmakelists_25/awolven[P]cimgui/./imgui/imgui.h"
                ,0x4f2,
                "T *ImVector<unsigned short>::insert(const T *, const T &) [T = unsigned short]");
}

Assistant:

CIMGUI_API ImDrawIdx* ImVector_ImDrawIdx_insert(ImVector_ImDrawIdx* self,ImDrawIdx const * it,const ImDrawIdx v)
{
    return self->insert(it,v);
}